

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

void __thiscall ObjLoader::parseFile(ObjLoader *this,string *filename)

{
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_00;
  pointer *ppvVar1;
  pointer *ppvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  iterator __position;
  iterator __position_00;
  pointer pvVar6;
  pointer paVar7;
  pointer pfVar8;
  pointer pfVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  pointer paVar14;
  int iVar15;
  int iVar17;
  pointer paVar18;
  long lVar19;
  long lVar20;
  iterator iVar21;
  long lVar22;
  ulong uVar23;
  string *psVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  SimpleMaterial material;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string err;
  attrib_t attrib;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_7c8;
  undefined1 local_7b0 [12];
  undefined4 uStack_7a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_790;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_784;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_778;
  float local_76c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
  *local_708;
  long local_700;
  pointer local_6f8;
  long local_6f0;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  ulong local_648;
  ulong local_640;
  vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
  *local_638;
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
  *local_630;
  pointer local_628;
  pointer local_620;
  pointer local_618;
  long local_610;
  attrib_t local_608;
  value_type local_5a0;
  int iVar16;
  
  local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  local_668._M_string_length = 0;
  local_668.field_2._M_local_buf[0] = '\0';
  bVar10 = tinyobj::LoadObj(&local_608,&local_6e8,&local_7c8,&local_668,(filename->_M_dataplus)._M_p
                            ,(this->m_rootDir)._M_dataplus._M_p,true);
  if (local_668._M_string_length != 0) {
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_668._M_dataplus._M_p,local_668._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  if (!bVar10) {
    exit(1);
  }
  local_5a0.name._M_dataplus._M_p = (pointer)&local_5a0.name.field_2;
  local_5a0.name._M_string_length = 0;
  local_5a0.name.field_2._M_local_buf[0] = '\0';
  local_5a0.ambient_texname._M_dataplus._M_p = (pointer)&local_5a0.ambient_texname.field_2;
  local_5a0.ambient_texname._M_string_length = 0;
  local_5a0.ambient_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.diffuse_texname._M_dataplus._M_p = (pointer)&local_5a0.diffuse_texname.field_2;
  local_5a0.diffuse_texname._M_string_length = 0;
  local_5a0.diffuse_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.specular_texname._M_dataplus._M_p = (pointer)&local_5a0.specular_texname.field_2;
  local_5a0.specular_texname._M_string_length = 0;
  local_5a0.specular_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.specular_highlight_texname._M_dataplus._M_p =
       (pointer)&local_5a0.specular_highlight_texname.field_2;
  local_5a0.specular_highlight_texname._M_string_length = 0;
  local_5a0.specular_highlight_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.bump_texname._M_dataplus._M_p = (pointer)&local_5a0.bump_texname.field_2;
  local_5a0.bump_texname._M_string_length = 0;
  local_5a0.bump_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.displacement_texname._M_dataplus._M_p = (pointer)&local_5a0.displacement_texname.field_2
  ;
  local_5a0.displacement_texname._M_string_length = 0;
  local_5a0.displacement_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.alpha_texname._M_dataplus._M_p = (pointer)&local_5a0.alpha_texname.field_2;
  local_5a0.alpha_texname._M_string_length = 0;
  local_5a0.alpha_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.reflection_texname._M_dataplus._M_p = (pointer)&local_5a0.reflection_texname.field_2;
  local_5a0.reflection_texname._M_string_length = 0;
  local_5a0.reflection_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.roughness_texname._M_dataplus._M_p = (pointer)&local_5a0.roughness_texname.field_2;
  local_5a0.roughness_texname._M_string_length = 0;
  local_5a0.roughness_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.metallic_texname._M_dataplus._M_p = (pointer)&local_5a0.metallic_texname.field_2;
  local_5a0.metallic_texname._M_string_length = 0;
  local_5a0.metallic_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.sheen_texname._M_dataplus._M_p = (pointer)&local_5a0.sheen_texname.field_2;
  local_5a0.sheen_texname._M_string_length = 0;
  local_5a0.sheen_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.emissive_texname._M_dataplus._M_p = (pointer)&local_5a0.emissive_texname.field_2;
  local_5a0.emissive_texname._M_string_length = 0;
  local_5a0.emissive_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.normal_texname._M_dataplus._M_p = (pointer)&local_5a0.normal_texname.field_2;
  local_5a0.normal_texname._M_string_length = 0;
  local_5a0.normal_texname.field_2._M_local_buf[0] = '\0';
  local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header;
  local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5a0.ambient[0] = 0.1;
  local_5a0.ambient[1] = 0.1;
  local_5a0.ambient[2] = 0.1;
  local_5a0.diffuse[0] = 0.3;
  local_5a0.specular[2] = 0.2;
  local_5a0.diffuse[1] = 0.3;
  local_5a0.diffuse[2] = 0.3;
  local_5a0.specular[0] = 0.2;
  local_5a0.specular[1] = 0.2;
  local_5a0.shininess = 1.0;
  local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_5a0.name,0,0,"default_material",0x10);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
            (&local_7c8,&local_5a0);
  if (local_7c8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_7c8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar19 = 0;
    uVar25 = 0;
    do {
      paVar7 = local_7c8.
               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_7b0._0_8_ = &local_7a0;
      stack0xfffffffffffff858 = 0;
      local_7a0._M_local_buf[0] = '\0';
      local_768._M_string_length = 0;
      local_768.field_2._M_local_buf[0] = '\0';
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      local_748._M_string_length = 0;
      local_748.field_2._M_local_buf[0] = '\0';
      local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
      local_728._M_string_length = 0;
      local_728.field_2._M_local_buf[0] = '\0';
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(local_7c8.
                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar19 + -0x20));
      psVar24 = (string *)((long)paVar7->emission + lVar19 + 0x40);
      local_790.field_0.z = *(float *)((long)paVar7->ambient + lVar19 + 8);
      local_790._0_8_ = *(undefined8 *)((long)paVar7->ambient + lVar19);
      local_784.field_0.z = *(float *)((long)paVar7->diffuse + lVar19 + 8);
      local_784._0_8_ = *(undefined8 *)((long)paVar7->diffuse + lVar19);
      local_778.field_0.z = *(float *)((long)paVar7->specular + lVar19 + 8);
      local_778._0_8_ = *(undefined8 *)((long)paVar7->specular + lVar19);
      local_76c = *(float *)((long)paVar7->emission + lVar19 + 0xc);
      iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(psVar24,"");
      if (iVar11 == 0) {
        psVar24 = &defaultDiffuseName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_768,psVar24);
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)(paVar7->roughness_texopt).origin_offset + lVar19 + -0x30);
      iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(this_02,"");
      psVar24 = this_02;
      if (iVar11 == 0) {
        psVar24 = &defaultNormalName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_748,psVar24);
      iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(this_02,"");
      psVar24 = (string *)((long)paVar7->emission + lVar19 + 0x60);
      if (iVar11 == 0) {
        psVar24 = &defaultDiffuseName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_728,psVar24);
      local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
      lVar22 = *(long *)((long)paVar7->emission + lVar19 + 0x40);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_688,lVar22,
                 *(long *)((long)paVar7->emission + lVar19 + 0x48) + lVar22);
      loadImage(this,&local_688);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
        operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
      }
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      lVar22 = *(long *)((long)(paVar7->roughness_texopt).origin_offset + lVar19 + -0x30);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6a8,lVar22,
                 *(long *)((long)(paVar7->roughness_texopt).origin_offset + lVar19 + -0x28) + lVar22
                );
      loadImage(this,&local_6a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
        operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
      }
      local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
      lVar22 = *(long *)((long)paVar7->emission + lVar19 + 0x60);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6c8,lVar22,
                 *(long *)((long)paVar7->emission + lVar19 + 0x68) + lVar22);
      loadImage(this,&local_6c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
        operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
      }
      std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::push_back
                (&this->m_materials,(value_type *)local_7b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._M_dataplus._M_p != &local_728.field_2) {
        operator_delete(local_728._M_dataplus._M_p,
                        CONCAT71(local_728.field_2._M_allocated_capacity._1_7_,
                                 local_728.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,
                        CONCAT71(local_748.field_2._M_allocated_capacity._1_7_,
                                 local_748.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,
                        CONCAT71(local_768.field_2._M_allocated_capacity._1_7_,
                                 local_768.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._0_8_ != &local_7a0) {
        operator_delete((void *)local_7b0._0_8_,
                        CONCAT71(local_7a0._M_allocated_capacity._1_7_,local_7a0._M_local_buf[0]) +
                        1);
      }
      uVar25 = uVar25 + 1;
      lVar19 = lVar19 + 0x570;
    } while (uVar25 < (ulong)(((long)local_7c8.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_7c8.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x66fd0eb66fd0eb67));
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->m_ibos,
           ((long)(this->m_materials).
                  super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_materials).
                  super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
  pfVar9 = local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar8 = local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_618 = local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_630 = (vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                 *)&this->m_vertexPositions;
    local_6f8 = local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
    this_00 = &this->m_vertexNormals;
    local_620 = local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_708 = (vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                 *)&this->m_vertexUVs;
    local_628 = local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_638 = (vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
                 *)&this->m_vertexColors;
    uVar25 = 0;
    paVar14 = local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar18 = local_6e8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    do {
      lVar19 = uVar25 * 0x80;
      if (paVar14[uVar25].mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          paVar14[uVar25].mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_6f0 = 0;
        uVar23 = 0;
        local_700 = lVar19;
        local_648 = uVar25;
        do {
          iVar5 = *(int *)(*(long *)((long)&(paVar14->mesh).material_ids.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + lVar19) + uVar23 * 4)
          ;
          iVar16 = (int)((long)local_7c8.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_7c8.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
          iVar15 = iVar16 * 0x6fd0eb67;
          iVar11 = iVar15 + -1;
          iVar17 = iVar11;
          if (SBORROW4(iVar5,iVar15) != iVar5 + iVar16 * -0x6fd0eb67 < 0) {
            iVar17 = iVar5;
          }
          if (iVar5 < 0) {
            iVar17 = iVar11;
          }
          local_610 = (long)iVar17;
          lVar22 = 8;
          local_640 = uVar23;
          do {
            lVar19 = *(long *)((long)&((local_6e8.
                                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar19) +
                     local_6f0;
            iVar11 = *(int *)(lVar22 + -8 + lVar19);
            lVar20 = (long)*(int *)(lVar22 + -4 + lVar19);
            iVar5 = *(int *)(lVar22 + lVar19);
            fVar31 = local_618[(long)(iVar11 * 3) + 2];
            local_7b0._0_8_ = *(undefined8 *)(local_618 + (long)iVar11 * 3);
            iVar21._M_current =
                 (this->m_vertexPositions).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_7b0._8_4_ = fVar31;
            if (iVar21._M_current ==
                (this->m_vertexPositions).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                        (local_630,iVar21,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
            }
            else {
              ((iVar21._M_current)->field_0).field_0.z = fVar31;
              *(undefined8 *)&(iVar21._M_current)->field_0 = local_7b0._0_8_;
              ppvVar1 = &(this->m_vertexPositions).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
            if (local_6f8 != pfVar8) {
              local_7b0._8_4_ = -pfVar8[lVar20 * 3 + 2];
              local_7b0._0_8_ = *(ulong *)(pfVar8 + lVar20 * 3) ^ 0x8000000080000000;
              iVar21._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar21._M_current ==
                  (this->m_vertexNormals).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                          ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                            *)this_00,iVar21,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                ((iVar21._M_current)->field_0).field_0.z = (float)local_7b0._8_4_;
                *(undefined8 *)&(iVar21._M_current)->field_0 = local_7b0._0_8_;
                ppvVar1 = &(this->m_vertexNormals).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
            }
            if (local_620 == pfVar9) {
              local_7b0._0_8_ = (pointer)0x0;
              std::
              vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                        (local_708,(vec<2,_float,_(glm::qualifier)0> *)local_7b0);
            }
            else {
              local_7b0._0_8_ = *(undefined8 *)(pfVar9 + (long)iVar5 * 2);
              std::
              vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                        (local_708,(vec<2,_float,_(glm::qualifier)0> *)local_7b0);
            }
            local_7b0._0_8_ = *(undefined8 *)(local_628 + (long)iVar11 * 3);
            uStack_7a4 = 0x3f800000;
            local_7b0._8_4_ = local_628[(long)(iVar11 * 3) + 2];
            __position._M_current =
                 (this->m_vertexColors).
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->m_vertexColors).
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<4,float,(glm::qualifier)0>>
                        (local_638,__position,(vec<4,_float,_(glm::qualifier)0> *)local_7b0);
            }
            else {
              *(undefined8 *)&(__position._M_current)->field_0 = local_7b0._0_8_;
              *(undefined8 *)((long)&(__position._M_current)->field_0 + 8) = stack0xfffffffffffff858
              ;
              ppvVar2 = &(this->m_vertexColors).
                         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar2 = *ppvVar2 + 1;
            }
            lVar19 = local_700;
            this_01 = (this->m_ibos).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_610;
            uVar12 = (int)((ulong)((long)(this->m_vertexPositions).
                                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_vertexPositions).
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555 - 1;
            local_7b0._0_4_ = uVar12;
            __position_00._M_current =
                 (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_01,__position_00,(uint *)local_7b0);
            }
            else {
              *__position_00._M_current = uVar12;
              (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            uVar23 = local_640;
            uVar25 = local_648;
            lVar22 = lVar22 + 0xc;
          } while (lVar22 != 0x2c);
          if (local_6f8 == pfVar8) {
            pvVar6 = (this->m_vertexPositions).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            fVar31 = pvVar6[-3].field_0.field_0.x;
            fVar29 = pvVar6[-2].field_0.field_0.x - fVar31;
            uVar3 = *(undefined8 *)((long)&pvVar6[-2].field_0 + 4);
            uVar4 = *(undefined8 *)((long)&pvVar6[-3].field_0 + 4);
            fVar26 = (float)uVar4;
            fVar27 = (float)uVar3 - fVar26;
            fVar30 = (float)((ulong)uVar4 >> 0x20);
            fVar28 = (float)((ulong)uVar3 >> 0x20) - fVar30;
            fVar26 = pvVar6[-1].field_0.field_0.y - fVar26;
            fVar30 = pvVar6[-1].field_0.field_0.z - fVar30;
            fVar31 = pvVar6[-1].field_0.field_0.x - fVar31;
            fVar32 = fVar27 * fVar30 - fVar28 * fVar26;
            fVar28 = fVar28 * fVar31 - fVar29 * fVar30;
            fVar31 = fVar26 * fVar29 - fVar31 * fVar27;
            fVar26 = 1.0 / SQRT(fVar28 * fVar28 + fVar32 * fVar32 + fVar31 * fVar31);
            local_7b0._0_8_ = CONCAT44(fVar26 * fVar28,fVar26 * fVar32);
            local_7b0._8_4_ = fVar31 * fVar26;
            iVar21._M_current =
                 (this->m_vertexNormals).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar21._M_current ==
                (this->m_vertexNormals).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                        ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                          *)this_00,iVar21,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              iVar21._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              ((iVar21._M_current)->field_0).field_0.z = fVar31 * fVar26;
              *(undefined8 *)&(iVar21._M_current)->field_0 = local_7b0._0_8_;
              iVar21._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              (this->m_vertexNormals).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar21._M_current;
            }
            if (iVar21._M_current ==
                (this->m_vertexNormals).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                        ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                          *)this_00,iVar21,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              iVar21._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              ((iVar21._M_current)->field_0).field_0.z = (float)local_7b0._8_4_;
              *(undefined8 *)&(iVar21._M_current)->field_0 = local_7b0._0_8_;
              iVar21._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              (this->m_vertexNormals).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar21._M_current;
            }
            if (iVar21._M_current ==
                (this->m_vertexNormals).
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                        ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                          *)this_00,iVar21,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
            }
            else {
              ((iVar21._M_current)->field_0).field_0.z = (float)local_7b0._8_4_;
              *(undefined8 *)&(iVar21._M_current)->field_0 = local_7b0._0_8_;
              ppvVar1 = &(this->m_vertexNormals).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
          }
          uVar23 = uVar23 + 1;
          local_6f0 = local_6f0 + 0x24;
          paVar14 = local_6e8.
                    super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
          paVar18 = local_6e8.
                    super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar23 < (ulong)(*(long *)((long)&((local_6e8.
                                                                                                          
                                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->mesh).
                                                  num_face_vertices.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                           lVar19) -
                                 *(long *)((long)&((local_6e8.
                                                                                                        
                                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->mesh).
                                                  num_face_vertices.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar19
                                          )));
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)((long)paVar18 - (long)paVar14 >> 7));
  }
  computeTangents(this);
  cleanUpDuplicates(this);
  tinyobj::anon_struct_1392_47_816f60ef::~material_t(&local_5a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,
                    CONCAT71(local_668.field_2._M_allocated_capacity._1_7_,
                             local_668.field_2._M_local_buf[0]) + 1);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_7c8);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&local_6e8);
  if (local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_608.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.normals.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.normals.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_608.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.vertices.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.vertices.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ObjLoader::parseFile(const std::string & filename)
{
  tinyobj::attrib_t attrib;
  std::vector<tinyobj::shape_t> shapes;
  std::vector<tinyobj::material_t> materials;
  std::string err;
  bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &err, filename.c_str(), m_rootDir.c_str());
  if (!err.empty()) {
    std::cerr << err << std::endl;
  }
  if (!ret) {
    exit(1);
  }

  // Loop over materials
  tinyobj::material_t defaultMaterial;
  defaultMaterial.ambient[0] = defaultMaterial.ambient[1] = defaultMaterial.ambient[2] = 0.1;
  defaultMaterial.diffuse[0] = defaultMaterial.diffuse[1] = defaultMaterial.diffuse[2] = 0.3;
  defaultMaterial.specular[0] = defaultMaterial.specular[1] = defaultMaterial.specular[2] = 0.2;
  defaultMaterial.shininess = 1;
  defaultMaterial.name = "default_material";
  materials.push_back(defaultMaterial);
  for (size_t m = 0; m < materials.size(); m++) {
    tinyobj::material_t * mp = &materials[m];
    SimpleMaterial material;
    material.name = mp->name;
    material.ambient = *reinterpret_cast<glm::vec3 *>(mp->ambient);
    material.diffuse = *reinterpret_cast<glm::vec3 *>(mp->diffuse);
    material.specular = *reinterpret_cast<glm::vec3 *>(mp->specular);
    material.shininess = mp->shininess;
    material.diffuseTexName = (mp->diffuse_texname != "") ? mp->diffuse_texname : defaultDiffuseName;
    material.normalTexName = (mp->normal_texname != "") ? mp->normal_texname : defaultNormalName;
    material.specularTexName = (mp->normal_texname != "") ? mp->specular_texname : defaultDiffuseName;
    loadImage(mp->diffuse_texname);
    loadImage(mp->normal_texname);
    loadImage(mp->specular_texname);
    m_materials.push_back(material);
  }

  m_ibos.resize(m_materials.size());
  // Loop over shapes
  for (size_t s = 0; s < shapes.size(); s++) {
    // Loop over faces(polygon)
    for (size_t f = 0; f < shapes[s].mesh.num_face_vertices.size(); f++) {
      int current_material_id = shapes[s].mesh.material_ids[f];
      if ((current_material_id < 0) || (current_material_id >= static_cast<int>(materials.size()))) {
        // Invalid material ID. Use default material.
        current_material_id = materials.size() - 1; // Default material is added to the last item in `materials`.
      }

      // Loop over vertices in the face.
      for (size_t v = 0; v < 3; v++) {
        // access to vertex
        tinyobj::index_t idx = shapes[s].mesh.indices[3 * f + v];
        tinyobj::real_t vx = attrib.vertices[3 * idx.vertex_index + 0];
        tinyobj::real_t vy = attrib.vertices[3 * idx.vertex_index + 1];
        tinyobj::real_t vz = attrib.vertices[3 * idx.vertex_index + 2];
        m_vertexPositions.push_back(glm::vec3(vx, vy, vz));

        if (attrib.normals.size() > 0) {
          tinyobj::real_t nx = attrib.normals[3 * idx.normal_index + 0];
          tinyobj::real_t ny = attrib.normals[3 * idx.normal_index + 1];
          tinyobj::real_t nz = attrib.normals[3 * idx.normal_index + 2];
          m_vertexNormals.push_back(-glm::vec3(nx, ny, nz));
        }
        if (attrib.texcoords.size() > 0) {
          tinyobj::real_t tx = attrib.texcoords[2 * idx.texcoord_index + 0];
          tinyobj::real_t ty = attrib.texcoords[2 * idx.texcoord_index + 1];
          m_vertexUVs.push_back(glm::vec2(tx, ty));
        } else {
          m_vertexUVs.push_back({0, 0});
        }
        //! note: beware attrib.colors is not empty even if no colors were specified (it is filled with black colors)
        tinyobj::real_t cR = attrib.colors[3 * idx.vertex_index + 0];
        tinyobj::real_t cG = attrib.colors[3 * idx.vertex_index + 1];
        tinyobj::real_t cB = attrib.colors[3 * idx.vertex_index + 2];
        tinyobj::real_t cA = 1;
        m_vertexColors.push_back(glm::vec4(cR, cG, cB, cA));
        m_ibos[current_material_id].push_back(m_vertexPositions.size() - 1);
      }

      // Compute the geometric normal if not specified.
      if (attrib.normals.size() == 0) {
        size_t nbVertices = m_vertexPositions.size();
        const glm::vec3 & v0 = m_vertexPositions[nbVertices - 3];
        const glm::vec3 & v1 = m_vertexPositions[nbVertices - 2];
        const glm::vec3 & v2 = m_vertexPositions[nbVertices - 1];
        glm::vec3 normal = calcNormal(v0, v1, v2);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
      }
    }
  }
  computeTangents();
  cleanUpDuplicates();
}